

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O3

void __thiscall adios2::query::Worker::Worker(Worker *this,string *queryFile,Engine *adiosEngine)

{
  pointer pcVar1;
  
  this->_vptr_Worker = (_func_int **)&PTR__Worker_008733e8;
  (this->m_QueryFile)._M_dataplus._M_p = (pointer)&(this->m_QueryFile).field_2;
  pcVar1 = (queryFile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_QueryFile,pcVar1,pcVar1 + queryFile->_M_string_length);
  this->m_SourceReader = adiosEngine;
  this->m_Query = (QueryBase *)0x0;
  return;
}

Assistant:

Worker::Worker(const std::string &queryFile, adios2::core::Engine *adiosEngine)
: m_QueryFile(queryFile), m_SourceReader(adiosEngine)
{
}